

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_wrt.c
# Opt level: O3

_Bool tool_create_output_file(OutStruct *outs)

{
  GlobalConfig *config;
  FILE *pFVar1;
  char *pcVar2;
  int *piVar3;
  char *fmt;
  char *pcVar4;
  
  pcVar4 = outs->filename;
  config = outs->config->global;
  if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
    warnf(config,"Remote filename has no length!\n");
    return false;
  }
  if (outs->is_cd_filename == true) {
    pFVar1 = fopen64(pcVar4,"rb");
    if (pFVar1 != (FILE *)0x0) {
      fclose(pFVar1);
      pcVar4 = outs->filename;
      pcVar2 = strerror(0x11);
      fmt = "Refusing to overwrite %s: %s\n";
      goto LAB_0010c6b8;
    }
    pcVar4 = outs->filename;
  }
  pFVar1 = fopen64(pcVar4,"wb");
  if (pFVar1 != (FILE *)0x0) {
    outs->s_isreg = true;
    outs->fopened = true;
    outs->stream = (FILE *)pFVar1;
    outs->bytes = 0;
    outs->init = 0;
    return true;
  }
  pcVar4 = outs->filename;
  piVar3 = __errno_location();
  pcVar2 = strerror(*piVar3);
  fmt = "Failed to create the file %s: %s\n";
LAB_0010c6b8:
  warnf(config,fmt,pcVar4,pcVar2);
  return false;
}

Assistant:

bool tool_create_output_file(struct OutStruct *outs)
{
  struct GlobalConfig *global = outs->config->global;
  FILE *file;

  if(!outs->filename || !*outs->filename) {
    warnf(global, "Remote filename has no length!\n");
    return FALSE;
  }

  if(outs->is_cd_filename) {
    /* don't overwrite existing files */
    file = fopen(outs->filename, "rb");
    if(file) {
      fclose(file);
      warnf(global, "Refusing to overwrite %s: %s\n", outs->filename,
            strerror(EEXIST));
      return FALSE;
    }
  }

  /* open file for writing */
  file = fopen(outs->filename, "wb");
  if(!file) {
    warnf(global, "Failed to create the file %s: %s\n", outs->filename,
          strerror(errno));
    return FALSE;
  }
  outs->s_isreg = TRUE;
  outs->fopened = TRUE;
  outs->stream = file;
  outs->bytes = 0;
  outs->init = 0;
  return TRUE;
}